

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::GenStructSizeOf
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,(anonymous_namespace)::Indent_abi_cxx11_,
             DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_c8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c8);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,(anonymous_namespace)::Indent_abi_cxx11_,
               DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_c8);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c8);
  }
  else {
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,(anonymous_namespace)::Indent_abi_cxx11_,
               DAT_003f5f70 + (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_c8);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar3 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar3) {
    local_78 = *puVar3;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar3;
    local_88 = (ulong *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)puVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  NumToString<unsigned_long>(&local_68,struct_def->bytesize);
  uVar5 = 0xf;
  if (local_88 != &local_78) {
    uVar5 = local_78;
  }
  if (uVar5 < local_68._M_string_length + local_80) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_80 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_0027e919;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_0027e919:
  local_a8 = &local_98;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_98 = *plVar1;
    uStack_90 = puVar2[3];
  }
  else {
    local_98 = *plVar1;
    local_a8 = (long *)*puVar2;
  }
  local_a0 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_b8 = *plVar4;
    lStack_b0 = plVar1[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar4;
    local_c8 = (long *)*plVar1;
  }
  local_c0 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_c8);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenStructSizeOf(const StructDef &struct_def,
                       std::string *code_ptr) const {
    auto &code = *code_ptr;
    code += Indent + "@classmethod\n";
    if (parser_.opts.python_typing) {
      code += Indent + "def SizeOf(cls) -> int:\n";
    } else {
      code += Indent + "def SizeOf(cls):\n";
    }
    code +=
        Indent + Indent + "return " + NumToString(struct_def.bytesize) + "\n";
    code += "\n";
  }